

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O1

int chain_segment_mix_bypass(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_segment *segment_00;
  mixed_segment *segment_01;
  int iVar2;
  byte bVar3;
  uint32_t location;
  uint uVar4;
  bool bVar5;
  mixed_channel_t outc;
  mixed_channel_t inc;
  mixed_buffer *outb;
  mixed_buffer *inb;
  byte local_42;
  byte local_41;
  mixed_buffer *local_40;
  mixed_buffer *local_38;
  
  iVar2 = (int)*(long *)((long)segment->data + 8);
  if (iVar2 == 0) {
    uVar4 = 1;
  }
  else {
    puVar1 = *segment->data;
    segment_00 = (mixed_segment *)*puVar1;
    segment_01 = (mixed_segment *)puVar1[iVar2 - 1];
    iVar2 = mixed_segment_get(0x24,&local_41,segment_00);
    uVar4 = 0;
    if (iVar2 != 0) {
      iVar2 = mixed_segment_get(0x25,&local_42,segment_01);
      uVar4 = 0;
      if (iVar2 != 0) {
        bVar3 = local_42;
        if (local_41 < local_42) {
          bVar3 = local_41;
        }
        bVar5 = bVar3 == 0;
        if (!bVar5) {
          location = 0;
          do {
            iVar2 = mixed_segment_get_in(0,location,&local_38,segment_00);
            if (iVar2 == 0) break;
            iVar2 = mixed_segment_get_out(0,location,&local_40,segment_01);
            if (iVar2 == 0) break;
            iVar2 = mixed_buffer_transfer(local_38,local_40);
            if (iVar2 == 0) break;
            location = location + 1;
            bVar3 = local_42;
            if (local_41 < local_42) {
              bVar3 = local_41;
            }
            bVar5 = location >= bVar3;
          } while (location < bVar3);
        }
        uVar4 = (uint)bVar5;
      }
    }
  }
  return uVar4;
}

Assistant:

int chain_segment_mix_bypass(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;

  if(count == 0) return 1;

  struct mixed_segment *in = data->data[0];
  struct mixed_segment *out = data->data[count-1];
  
  mixed_channel_t inc, outc;
  if(!mixed_segment_get(MIXED_IN_COUNT, &inc, in)) return 0;
  if(!mixed_segment_get(MIXED_OUT_COUNT, &outc, out)) return 0;
  
  for(mixed_channel_t c=0; c<MIN(inc,outc); ++c){
    struct mixed_buffer *inb, *outb;
    if(!mixed_segment_get_in(MIXED_BUFFER, c, &inb, in)) return 0;
    if(!mixed_segment_get_out(MIXED_BUFFER, c, &outb, out)) return 0;
    if(!mixed_buffer_transfer(inb, outb)) return 0;
  }
  return 1;
}